

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xmlparse.c
# Opt level: O0

ATTRIBUTE_ID * getAttributeId(XML_Parser parser,ENCODING *enc,char *start,char *end)

{
  XML_Char XVar1;
  DTD *pDVar2;
  XML_Bool XVar3;
  XML_Char *pXVar4;
  KEY name_00;
  PREFIX *pPVar5;
  int local_50;
  int local_4c;
  int j;
  int i;
  XML_Char *name;
  ATTRIBUTE_ID *id;
  DTD *dtd;
  char *end_local;
  char *start_local;
  ENCODING *enc_local;
  XML_Parser parser_local;
  
  pDVar2 = parser->m_dtd;
  if (((pDVar2->pool).ptr == (pDVar2->pool).end) && (XVar3 = poolGrow(&pDVar2->pool), XVar3 == '\0')
     ) {
    parser_local = (XML_Parser)0x0;
  }
  else {
    pXVar4 = (pDVar2->pool).ptr;
    (pDVar2->pool).ptr = pXVar4 + 1;
    *pXVar4 = '\0';
    pXVar4 = poolStoreString(&pDVar2->pool,enc,start,end);
    if (pXVar4 == (XML_Char *)0x0) {
      parser_local = (XML_Parser)0x0;
    }
    else {
      name_00 = pXVar4 + 1;
      parser_local = (XML_Parser)lookup(parser,&pDVar2->attributeIds,name_00,0x18);
      if (parser_local == (XML_Parser)0x0) {
        parser_local = (XML_Parser)0x0;
      }
      else if ((KEY)parser_local->m_userData == name_00) {
        (pDVar2->pool).start = (pDVar2->pool).ptr;
        if (parser->m_ns != '\0') {
          if (((((*name_00 == 'x') && (pXVar4[2] == 'm')) && (pXVar4[3] == 'l')) &&
              ((pXVar4[4] == 'n' && (pXVar4[5] == 's')))) &&
             ((pXVar4[6] == '\0' || (pXVar4[6] == ':')))) {
            if (pXVar4[6] == '\0') {
              parser_local->m_handlerArg = &pDVar2->defaultPrefix;
            }
            else {
              pPVar5 = (PREFIX *)lookup(parser,&pDVar2->prefixes,pXVar4 + 7,0x10);
              parser_local->m_handlerArg = pPVar5;
            }
            *(XML_Bool *)((long)&parser_local->m_buffer + 1) = '\x01';
          }
          else {
            for (local_4c = 0; name_00[local_4c] != '\0'; local_4c = local_4c + 1) {
              if (name_00[local_4c] == ':') {
                for (local_50 = 0; local_50 < local_4c; local_50 = local_50 + 1) {
                  if (((pDVar2->pool).ptr == (pDVar2->pool).end) &&
                     (XVar3 = poolGrow(&pDVar2->pool), XVar3 == '\0')) {
                    return (ATTRIBUTE_ID *)0x0;
                  }
                  XVar1 = name_00[local_50];
                  pXVar4 = (pDVar2->pool).ptr;
                  (pDVar2->pool).ptr = pXVar4 + 1;
                  *pXVar4 = XVar1;
                }
                if (((pDVar2->pool).ptr == (pDVar2->pool).end) &&
                   (XVar3 = poolGrow(&pDVar2->pool), XVar3 == '\0')) {
                  return (ATTRIBUTE_ID *)0x0;
                }
                pXVar4 = (pDVar2->pool).ptr;
                (pDVar2->pool).ptr = pXVar4 + 1;
                *pXVar4 = '\0';
                pPVar5 = (PREFIX *)lookup(parser,&pDVar2->prefixes,(pDVar2->pool).start,0x10);
                parser_local->m_handlerArg = pPVar5;
                if ((PREFIX *)parser_local->m_handlerArg == (PREFIX *)0x0) {
                  return (ATTRIBUTE_ID *)0x0;
                }
                if (((PREFIX *)parser_local->m_handlerArg)->name == (pDVar2->pool).start) {
                  (pDVar2->pool).start = (pDVar2->pool).ptr;
                  return (ATTRIBUTE_ID *)parser_local;
                }
                (pDVar2->pool).ptr = (pDVar2->pool).start;
                return (ATTRIBUTE_ID *)parser_local;
              }
            }
          }
        }
      }
      else {
        (pDVar2->pool).ptr = (pDVar2->pool).start;
      }
    }
  }
  return (ATTRIBUTE_ID *)parser_local;
}

Assistant:

static ATTRIBUTE_ID *
getAttributeId(XML_Parser parser, const ENCODING *enc, const char *start,
               const char *end) {
  DTD *const dtd = parser->m_dtd; /* save one level of indirection */
  ATTRIBUTE_ID *id;
  const XML_Char *name;
  if (! poolAppendChar(&dtd->pool, XML_T('\0')))
    return NULL;
  name = poolStoreString(&dtd->pool, enc, start, end);
  if (! name)
    return NULL;
  /* skip quotation mark - its storage will be re-used (like in name[-1]) */
  ++name;
  id = (ATTRIBUTE_ID *)lookup(parser, &dtd->attributeIds, name,
                              sizeof(ATTRIBUTE_ID));
  if (! id)
    return NULL;
  if (id->name != name)
    poolDiscard(&dtd->pool);
  else {
    poolFinish(&dtd->pool);
    if (! parser->m_ns)
      ;
    else if (name[0] == XML_T(ASCII_x) && name[1] == XML_T(ASCII_m)
             && name[2] == XML_T(ASCII_l) && name[3] == XML_T(ASCII_n)
             && name[4] == XML_T(ASCII_s)
             && (name[5] == XML_T('\0') || name[5] == XML_T(ASCII_COLON))) {
      if (name[5] == XML_T('\0'))
        id->prefix = &dtd->defaultPrefix;
      else
        id->prefix = (PREFIX *)lookup(parser, &dtd->prefixes, name + 6,
                                      sizeof(PREFIX));
      id->xmlns = XML_TRUE;
    } else {
      int i;
      for (i = 0; name[i]; i++) {
        /* attributes without prefix are *not* in the default namespace */
        if (name[i] == XML_T(ASCII_COLON)) {
          int j;
          for (j = 0; j < i; j++) {
            if (! poolAppendChar(&dtd->pool, name[j]))
              return NULL;
          }
          if (! poolAppendChar(&dtd->pool, XML_T('\0')))
            return NULL;
          id->prefix = (PREFIX *)lookup(parser, &dtd->prefixes,
                                        poolStart(&dtd->pool), sizeof(PREFIX));
          if (! id->prefix)
            return NULL;
          if (id->prefix->name == poolStart(&dtd->pool))
            poolFinish(&dtd->pool);
          else
            poolDiscard(&dtd->pool);
          break;
        }
      }
    }
  }
  return id;
}